

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

int Extra_bddCountCubes(DdManager *dd,DdNode **pFuncs,int nFuncs,int fMode,int nLimit,int *pGuide)

{
  int iVar1;
  DdNode *pDVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int Count1;
  int Count0;
  int local_64;
  int local_60;
  int local_5c;
  int *local_58;
  ulong local_50;
  st__table *local_48;
  DdManager *local_40;
  uint local_38;
  uint local_34;
  ulong uVar6;
  
  uVar7 = (ulong)(uint)fMode;
  local_58 = pGuide;
  local_48 = st__init_table(st__ptrcmp,st__ptrhash);
  local_38 = dd->maxLive;
  dd->maxLive = (dd->keys - dd->dead) + 1000000;
  local_40 = dd;
  if (nFuncs < 1) {
    iVar4 = 0;
    iVar8 = 0;
  }
  else {
    local_34 = fMode + 1;
    uVar5 = 0;
    iVar8 = 0;
    local_5c = nFuncs;
    local_50 = uVar7;
    do {
      pDVar2 = pFuncs[uVar5];
      if (pDVar2 != (DdNode *)0x0) {
        local_64 = nLimit;
        local_60 = nLimit;
        if (((int)uVar7 == 1) || ((int)uVar7 == -1)) {
          pDVar2 = extraBddCountCubes(local_40,pDVar2,pDVar2,local_48,&local_64,nLimit);
          bVar9 = pDVar2 != (DdNode *)0x0;
        }
        else {
          bVar9 = false;
        }
        pDVar2 = (DdNode *)((ulong)pFuncs[uVar5] ^ 1);
        pFuncs[uVar5] = pDVar2;
        if (local_34 < 2) {
          pDVar2 = extraBddCountCubes(local_40,pDVar2,pDVar2,local_48,&local_60,local_64);
          bVar10 = pDVar2 != (DdNode *)0x0;
        }
        else {
          bVar10 = false;
        }
        *(byte *)(pFuncs + uVar5) = *(byte *)(pFuncs + uVar5) ^ 1;
        uVar6 = uVar5;
        if (!(bool)(bVar9 | bVar10)) break;
        if (bVar10) {
          if (bVar9) {
            if (local_60 < local_64) {
              local_58[uVar5] = 0;
              piVar3 = &local_60;
            }
            else {
              local_58[uVar5] = 1;
              piVar3 = &local_64;
            }
          }
          else {
            local_58[uVar5] = 0;
            piVar3 = &local_60;
          }
        }
        else {
          local_58[uVar5] = 1;
          piVar3 = &local_64;
        }
        iVar8 = iVar8 + *piVar3;
        uVar7 = local_50;
      }
      uVar5 = uVar5 + 1;
      uVar6 = (ulong)(uint)nFuncs;
    } while ((uint)nFuncs != uVar5);
    iVar4 = (int)uVar6;
    nFuncs = local_5c;
  }
  local_40->maxLive = local_38;
  st__free_table(local_48);
  iVar1 = -1;
  if (iVar4 == nFuncs) {
    iVar1 = iVar8;
  }
  return iVar1;
}

Assistant:

int Extra_bddCountCubes( DdManager * dd, DdNode ** pFuncs, int nFuncs, int fMode, int nLimit, int * pGuide )
{
    DdNode * pF0, * pF1; 
    int i, Count, Count0, Count1, CounterAll = 0;
    st__table *table = st__init_table( st__ptrcmp, st__ptrhash );
    unsigned int saveLimit = dd->maxLive;
    dd->maxLive = dd->keys - dd->dead + 1000000; // limit on intermediate BDD nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        if ( !pFuncs[i] )
            continue;
        pF1 = pF0 = NULL;
        Count0 = Count1 = nLimit;
        if ( fMode == -1 || fMode == 1 ) // both or pos
            pF1 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count1, nLimit );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( fMode == -1 || fMode == 0 ) // both or neg
            pF0 = extraBddCountCubes( dd, pFuncs[i], pFuncs[i], table, &Count0, Count1 );
        pFuncs[i] = Cudd_Not( pFuncs[i] );
        if ( !pF1 && !pF0 )
            break;
        if ( !pF0 )                  pGuide[i] = 1, Count = Count1; // use pos
        else if ( !pF1 )             pGuide[i] = 0, Count = Count0; // use neg
        else if ( Count1 <= Count0 ) pGuide[i] = 1, Count = Count1; // use pos
        else                         pGuide[i] = 0, Count = Count0; // use neg
        CounterAll += Count;
        //printf( "Output %5d has %5d cubes (%d)  (%5d and %5d)\n", nOuts++, Count, pGuide[i], Count1, Count0 );
    }
    dd->maxLive = saveLimit;
    st__free_table( table );
    return i == nFuncs ? CounterAll : -1;
}